

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O2

int XNVCTRLStringOperation
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,char *pIn
              ,char **ppOut)

{
  XExtDisplayInfo *info;
  size_t sVar1;
  undefined1 *puVar2;
  char *pcVar3;
  _func_int__XDisplay_ptr *p_Var4;
  int iVar5;
  CARD32 CVar6;
  long lVar7;
  int target_id_local;
  int target_type_local;
  xnvCtrlStringOperationReply rep;
  
  target_id_local = target_id;
  target_type_local = target_type;
  info = find_display(dpy);
  if (info == (XExtDisplayInfo *)0x0) {
    return 0;
  }
  if (ppOut == (char **)0x0) {
    return 0;
  }
  if (info->codes == (XExtCodes *)0x0) {
    return 0;
  }
  *ppOut = (char *)0x0;
  if (info->codes == (XExtCodes *)0x0) {
    XMissingExtension(dpy,"NV-CONTROL");
    return 0;
  }
  XNVCTRLCheckTargetData(dpy,info,&target_type_local,&target_id_local);
  if (pIn == (char *)0x0) {
    iVar5 = 0;
  }
  else {
    sVar1 = strlen(pIn);
    iVar5 = (int)sVar1 + 1;
  }
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->lock_display)(dpy);
  }
  puVar2 = (undefined1 *)_XGetRequest(dpy,0x19,0x14);
  *puVar2 = (char)info->codes->major_opcode;
  puVar2[1] = 0x19;
  *(undefined2 *)(puVar2 + 6) = (undefined2)target_type_local;
  *(short *)(puVar2 + 2) = *(short *)(puVar2 + 2) + (short)(iVar5 + 3U >> 2);
  *(undefined2 *)(puVar2 + 4) = (undefined2)target_id_local;
  *(uint *)(puVar2 + 8) = display_mask;
  *(uint *)(puVar2 + 0xc) = attribute;
  *(int *)(puVar2 + 0x10) = iVar5;
  if (pIn != (char *)0x0) {
    if (dpy->bufmax < dpy->bufptr + iVar5) {
      _XSend(dpy,pIn);
    }
    else {
      memcpy(dpy->bufptr,pIn,(long)iVar5);
      dpy->bufptr = dpy->bufptr + (int)(iVar5 + 3U & 0xfffffffc);
    }
  }
  iVar5 = _XReply(dpy,&rep,0,0);
  if (iVar5 == 0) {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->unlock_display)(dpy);
    }
    p_Var4 = dpy->synchandler;
    CVar6 = 0;
    goto LAB_00105e01;
  }
  lVar7 = (long)(int)rep.length;
  if (rep.num_bytes == 0) {
    pcVar3 = *ppOut;
  }
  else {
    pcVar3 = (char *)malloc((long)(int)rep.num_bytes);
    *ppOut = pcVar3;
  }
  if (pcVar3 == (char *)0x0) {
LAB_00105e24:
    _XEatData(dpy,lVar7);
  }
  else {
    _XRead(dpy,pcVar3,(long)(int)rep.num_bytes);
    if ((rep.num_bytes & 3) != 0) {
      lVar7 = 4 - (ulong)(rep.num_bytes & 3);
      goto LAB_00105e24;
    }
  }
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->unlock_display)(dpy);
  }
  p_Var4 = dpy->synchandler;
  CVar6 = rep.ret;
LAB_00105e01:
  if (p_Var4 != (_func_int__XDisplay_ptr *)0x0) {
    (*p_Var4)(dpy);
  }
  return CVar6;
}

Assistant:

Bool XNVCTRLStringOperation (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    char *pIn,
    char **ppOut
) {
    XExtDisplayInfo *info = find_display(dpy);
    xnvCtrlStringOperationReq *req;
    xnvCtrlStringOperationReply rep;
    Bool ret;
    int inSize, outSize, length, slop;

    if (!XextHasExtension(info))
        return False;
    
    if (!ppOut)
        return False;

    *ppOut = NULL;
    
    XNVCTRLCheckExtension(dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);
    
    if (pIn) {
        inSize = strlen(pIn) + 1;
    } else {
        inSize = 0;
    }
    
    LockDisplay(dpy);
    GetReq(nvCtrlStringOperation, req);
    
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlStringOperation;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;

    req->length += ((inSize + 3) & ~3) >> 2;
    req->num_bytes = inSize;
    
    if (pIn) {
        Data(dpy, pIn, inSize);
    }
    
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay(dpy);
        SyncHandle();
        return False;
    }
    
    length = rep.length;
    outSize = rep.num_bytes;
    slop = outSize & 3;

    if (outSize) *ppOut = (char *) Xmalloc(outSize);
    
    if (!*ppOut) {
        _XEatData(dpy, length);
    } else {
        _XRead(dpy, (char *) *ppOut, outSize);
        if (slop) _XEatData(dpy, 4-slop);
    }
    
    ret = rep.ret;
    
    UnlockDisplay(dpy);
    SyncHandle();
    
    return ret;
}